

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O3

void __thiscall front::syntax::SyntaxAnalyze::gm_while_stmt_normal(SyntaxAnalyze *this)

{
  irGenerator *this_00;
  int *piVar1;
  LabelId bbTrue;
  uint uVar2;
  LabelId label;
  WhileLabels wl;
  bool bVar3;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> condStr
  ;
  string tmpName;
  anon_class_1_0_00000001 local_149;
  ulong local_148;
  long *local_140;
  long local_138;
  long local_130 [2];
  char local_120;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_118;
  bool local_f8;
  string local_f0;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_d0;
  bool local_b0;
  _Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  byte local_88;
  _Variadic_union<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  byte local_60;
  RightVal local_58;
  
  this_00 = &this->irGenerator;
  bbTrue = irGenerator::irGenerator::getNewLabelId(this_00);
  uVar2 = irGenerator::irGenerator::getNewLabelId(this_00);
  label = irGenerator::irGenerator::getNewLabelId(this_00);
  local_120 = '\0';
  wl._endLabel = uVar2;
  wl._beginLabel = label;
  local_148 = (ulong)uVar2;
  irGenerator::irGenerator::pushWhile(this_00,wl);
  irGenerator::irGenerator::ir_label(this_00,label);
  match_one_word(this,WHILETK);
  match_one_word(this,LPARENT);
  gm_cond((SyntaxAnalyze *)&local_80._M_first);
  piVar1 = (int *)CONCAT44(local_80._4_4_,local_80._M_first._M_storage);
  if (*piVar1 == 0) {
    irGenerator::irGenerator::getNewTmpValueName_abi_cxx11_(&local_f0,this_00,Int);
    local_80._M_first._M_storage = (_Uninitialized<int,_true>)piVar1[2];
    local_60 = 0;
    std::get<0ul,int,int,std::__cxx11::string>
              ((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_80._M_first);
    local_a8._0_8_ = (long)&local_a8 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a8,local_f0._M_dataplus._M_p,
               local_f0._M_dataplus._M_p + local_f0._M_string_length);
    local_88 = 1;
    std::__detail::__variant::
    _Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_58,
                      (_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_80._M_first);
    irGenerator::irGenerator::ir_assign(this_00,(LeftVal *)&local_a8._M_first,&local_58);
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
      ::_S_vtable._M_arr
      [local_58.
       super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
       super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
       super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
       super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
       super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_index]._M_data)
              (&local_149,&local_58);
    local_58.
    super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
    super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
    super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
    super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
    super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_index = 0xff;
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
      ::_S_vtable._M_arr[local_88]._M_data)
              (&local_149,
               (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_a8._M_first);
    local_88 = 0xff;
    std::optional<std::__cxx11::string>::operator=
              ((optional<std::__cxx11::string> *)&local_140,&local_f0);
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
      ::_S_vtable._M_arr[local_60]._M_data)
              (&local_149,
               (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_80._M_first);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    std::optional<std::__cxx11::string>::operator=
              ((optional<std::__cxx11::string> *)&local_140,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(piVar1 + 4));
  }
  local_f8 = false;
  bVar3 = local_120 == '\x01';
  if (bVar3) {
    local_118._M_value._M_dataplus._M_p = (_Alloc_hider)((long)&local_118._M_value + 0x10);
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_118,local_140,local_138 + (long)local_140);
  }
  local_f8 = bVar3;
  irGenerator::irGenerator::ir_jump
            (this_00,BrCond,bbTrue,(LabelId)local_148,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_118,Loop);
  if (local_f8 == true) {
    local_f8 = false;
    if (local_118._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_118._M_value + 0x10)) {
      operator_delete((void *)local_118._M_value._M_dataplus._M_p,local_118._16_8_ + 1);
    }
  }
  irGenerator::irGenerator::ir_label(this_00,bbTrue);
  match_one_word(this,RPARENT);
  gm_stmt(this);
  local_b0 = false;
  irGenerator::irGenerator::ir_jump
            (this_00,Br,label,-1,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_d0,Loop);
  if (local_b0 == true) {
    local_b0 = false;
    if (local_d0._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_d0._M_value + 0x10)) {
      operator_delete((void *)local_d0._M_value._M_dataplus._M_p,local_d0._16_8_ + 1);
    }
  }
  irGenerator::irGenerator::ir_label(this_00,(LabelId)local_148);
  irGenerator::irGenerator::popWhile(this_00);
  if (local_120 == '\x01') {
    local_120 = '\0';
    if (local_140 != local_130) {
      operator_delete(local_140,local_130[0] + 1);
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_);
  }
  return;
}

Assistant:

void SyntaxAnalyze::gm_while_stmt_normal() {
  SharedExNdPtr cond;
  LabelId whileTrue = irGenerator.getNewLabelId();
  LabelId whileEnd = irGenerator.getNewLabelId();
  LabelId whileBegin = irGenerator.getNewLabelId();
  std::optional<string> condStr;
  irGenerator::WhileLabels whileLabels =
      irGenerator::WhileLabels(whileBegin, whileEnd);

  irGenerator.pushWhile(whileLabels);
  irGenerator.ir_label(whileBegin);

  match_one_word(Token::WHILETK);
  match_one_word(Token::LPARENT);

  cond = gm_cond();

  if (cond->_type == NodeType::CNS) {
    string tmpName = irGenerator.getNewTmpValueName(TyKind::Int);
    RightVal right;
    right.emplace<0>(cond->_value);
    irGenerator.ir_assign(tmpName, right);
    condStr = tmpName;
  } else {
    condStr = cond->_name;
  }
  irGenerator.ir_jump(mir::inst::JumpInstructionKind::BrCond, whileTrue,
                      whileEnd, condStr, mir::inst::JumpKind::Loop);
  irGenerator.ir_label(whileTrue);

  match_one_word(Token::RPARENT);
  gm_stmt();

  irGenerator.ir_jump(mir::inst::JumpInstructionKind::Br, whileBegin, -1,
                      std::nullopt, mir::inst::JumpKind::Loop);
  irGenerator.ir_label(whileEnd);
  irGenerator.popWhile();
}